

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

bool __thiscall
cmGraphVizWriter::GenerateForTargetType(cmGraphVizWriter *this,TargetType targetType)

{
  undefined1 uVar1;
  
  uVar1 = 0;
  switch(targetType) {
  case EXECUTABLE:
    uVar1 = this->GenerateForExecutables;
    break;
  case STATIC_LIBRARY:
    return this->GenerateForStaticLibs;
  case SHARED_LIBRARY:
    return this->GenerateForSharedLibs;
  case MODULE_LIBRARY:
    return this->GenerateForModuleLibs;
  case INTERFACE_LIBRARY:
    return this->GenerateForInterface;
  }
  return (bool)uVar1;
}

Assistant:

bool cmGraphVizWriter::GenerateForTargetType(
  cmStateEnums::TargetType targetType) const
{
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      return this->GenerateForExecutables;
    case cmStateEnums::STATIC_LIBRARY:
      return this->GenerateForStaticLibs;
    case cmStateEnums::SHARED_LIBRARY:
      return this->GenerateForSharedLibs;
    case cmStateEnums::MODULE_LIBRARY:
      return this->GenerateForModuleLibs;
    case cmStateEnums::INTERFACE_LIBRARY:
      return this->GenerateForInterface;
    default:
      break;
  }
  return false;
}